

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

el_action_t ed_next_char(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  pwVar2 = (el->el_line).cursor;
  pwVar3 = (el->el_line).lastchar;
  if (pwVar3 <= pwVar2) {
    return '\x06';
  }
  wVar1 = (el->el_map).type;
  if (pwVar2 == pwVar3 + -1) {
    if (wVar1 != L'\x01') {
      pwVar4 = pwVar2 + (el->el_state).argument;
      if (pwVar3 < pwVar2 + (el->el_state).argument) {
        pwVar4 = pwVar3;
      }
      (el->el_line).cursor = pwVar4;
      return '\x05';
    }
    if ((el->el_chared).c_vcmd.action == L'\0') {
      return '\x06';
    }
    pwVar4 = pwVar2 + (el->el_state).argument;
    if (pwVar3 < pwVar2 + (el->el_state).argument) {
      pwVar4 = pwVar3;
    }
    (el->el_line).cursor = pwVar4;
  }
  else {
    pwVar4 = pwVar2 + (el->el_state).argument;
    if (pwVar3 < pwVar2 + (el->el_state).argument) {
      pwVar4 = pwVar3;
    }
    (el->el_line).cursor = pwVar4;
    if (wVar1 != L'\x01') {
      return '\x05';
    }
  }
  if ((el->el_chared).c_vcmd.action == L'\0') {
    return '\x05';
  }
  cv_delfini(el);
  return '\x04';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_char(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *lim = el->el_line.lastchar;

	if (el->el_line.cursor >= lim ||
	    (el->el_line.cursor == lim - 1 &&
	    el->el_map.type == MAP_VI &&
	    el->el_chared.c_vcmd.action == NOP))
		return CC_ERROR;

	el->el_line.cursor += el->el_state.argument;
	if (el->el_line.cursor > lim)
		el->el_line.cursor = lim;

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}